

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  cmOutputConverter *this_00;
  cmGeneratorTarget *this_01;
  cmLocalNinjaGenerator *pcVar1;
  undefined8 *puVar2;
  cmCustomCommand *pcVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmMakefile *this_02;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  MapToNinjaPathImpl MVar11;
  long lVar12;
  cmCustomCommand *pcVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  char *pcVar15;
  cmGeneratedFileStream *pcVar16;
  string *util_output;
  pointer *ppcVar17;
  allocator<char> local_39a;
  allocator<char> local_399;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> cmdLists;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  cmGlobalNinjaGenerator *local_370;
  string local_368;
  string local_348;
  cmLocalNinjaGenerator *local_328;
  undefined8 local_320;
  cmNinjaDeps deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmNinjaDeps util_outputs;
  string utilCommandName;
  string local_2a0;
  cmCustomCommandGenerator ccg;
  cmNinjaDeps local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  cmNinjaBuild phonyBuild;
  
  local_370 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
  std::__cxx11::string::string((string *)&utilCommandName,(string *)psVar9);
  std::__cxx11::string::append((char *)&utilCommandName);
  std::__cxx11::string::append((char *)&utilCommandName);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
  std::operator+(&phonyBuild.Comment,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ccg,".util");
  std::__cxx11::string::append((string *)&utilCommandName);
  std::__cxx11::string::~string((string *)&phonyBuild);
  std::__cxx11::string::~string((string *)&ccg);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&phonyBuild.Comment,&this->super_cmNinjaTargetGenerator,&utilCommandName);
  std::__cxx11::string::operator=((string *)&utilCommandName,(string *)&phonyBuild);
  std::__cxx11::string::~string((string *)&phonyBuild);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"phony",(allocator<char> *)&ccg);
  cmNinjaBuild::cmNinjaBuild(&phonyBuild,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  local_328 = pcVar1;
  cmdLists._M_elems[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists._M_elems[1] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  local_320 = 0;
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
    puVar2 = *(undefined8 **)((long)cmdLists._M_elems + lVar12);
    pcVar3 = (cmCustomCommand *)puVar2[1];
    for (pcVar13 = (cmCustomCommand *)*puVar2; pcVar13 != pcVar3; pcVar13 = pcVar13 + 1) {
      psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string((string *)&local_178,(string *)psVar9);
      pcVar1 = local_328;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,pcVar13,&local_178,(cmLocalGenerator *)local_328);
      std::__cxx11::string::~string((string *)&local_178);
      cmLocalNinjaGenerator::AppendCustomCommandDeps(pcVar1,&ccg,&deps);
      cmLocalNinjaGenerator::AppendCustomCommandLines(pcVar1,&ccg,&commands);
      pvVar10 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var4._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar11.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&util_outputs,MVar11);
      bVar7 = cmCustomCommand::GetUsesTerminal(pcVar13);
      local_320 = CONCAT71((int7)((ulong)local_320 >> 8),(byte)local_320 | bVar7);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    }
  }
  this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ccg,"CMAKE_BUILD_TYPE",(allocator<char> *)&cmdLists);
  psVar9 = cmMakefile::GetSafeDefinition(this_02,(string *)&ccg);
  std::__cxx11::string::~string((string *)&ccg);
  cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  local_388._M_allocated_capacity = 0;
  cmGeneratorTarget::GetSourceFiles
            (this_01,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists,psVar9);
  pvVar6 = cmdLists._M_elems[1];
  for (ppcVar17 = (pointer *)cmdLists._M_elems[0];
      (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)ppcVar17 != pvVar6;
      ppcVar17 = ppcVar17 + 1) {
    pcVar13 = cmSourceFile::GetCustomCommand((cmSourceFile *)*ppcVar17);
    if (pcVar13 != (cmCustomCommand *)0x0) {
      psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      std::__cxx11::string::string((string *)&local_198,(string *)psVar9);
      pcVar1 = local_328;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,pcVar13,&local_198,(cmLocalGenerator *)local_328);
      std::__cxx11::string::~string((string *)&local_198);
      cmLocalNinjaGenerator::AddCustomCommandTarget(pcVar1,pcVar13,this_01);
      pvVar10 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
      pvVar14 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var4._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar11.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&deps,MVar11);
      _Var4._M_current =
           (pvVar14->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar14->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar11.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&deps,MVar11);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
    }
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists);
  pcVar1 = local_328;
  cmLocalNinjaGenerator::AppendTargetOutputs(local_328,this_01,&phonyBuild.Outputs);
  cmLocalNinjaGenerator::AppendTargetDepends(pcVar1,this_01,&deps,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&cmdLists,&this->super_cmNinjaTargetGenerator);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ccg,
                   "Utility command for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmdLists);
    std::__cxx11::string::operator=((string *)&phonyBuild,(string *)&ccg);
    std::__cxx11::string::~string((string *)&ccg);
    std::__cxx11::string::~string((string *)&cmdLists);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&phonyBuild.ExplicitDeps,&deps);
    pcVar16 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild(local_370,(ostream *)pcVar16,&phonyBuild,0,(bool *)0x0);
LAB_0023d989:
    TVar8 = cmGeneratorTarget::GetType(this_01);
    if (TVar8 == GLOBAL_TARGET) goto LAB_0023d9ce;
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias(local_370,(string *)&ccg,this_01);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmdLists,"utility",(allocator<char> *)&local_368);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&ccg,pcVar1,&commands,(string *)&cmdLists,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    std::__cxx11::string::~string((string *)&cmdLists);
    cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_388;
    cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
    local_388._M_allocated_capacity = local_388._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"EchoString",(allocator<char> *)&local_348);
    pcVar15 = cmGeneratorTarget::GetProperty(this_01,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    if (pcVar15 == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_348,&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_368,"Running utility command for ",&local_348);
      std::__cxx11::string::operator=((string *)&cmdLists,(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_348);
    }
    else {
      std::__cxx11::string::assign((char *)&cmdLists);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"$(CMAKE_SOURCE_DIR)",(allocator<char> *)&local_2a0);
    psVar9 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    this_00 = &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
    ;
    cmOutputConverter::ConvertToOutputFormat(&local_348,this_00,psVar9,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&ccg,&local_368,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"$(CMAKE_BINARY_DIR)",(allocator<char> *)&local_2a0);
    psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmOutputConverter::ConvertToOutputFormat(&local_348,this_00,psVar9,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&ccg,&local_368,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    cmsys::SystemTools::ReplaceString((string *)&ccg,"$(ARGS)","");
    lVar12 = std::__cxx11::string::find((char)&ccg,0x24);
    if (lVar12 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (local_370,
                   util_outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_348,&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_368,"Utility command for ",&local_348);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_399);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_39a);
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (local_370,(string *)&ccg,(string *)&cmdLists,&local_368,&local_2a0,&local_1b8,
                 (bool)((byte)local_320 & 1),true,&util_outputs,&deps,&local_1d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_348);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&phonyBuild.ExplicitDeps,&utilCommandName);
      pcVar16 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild(local_370,(ostream *)pcVar16,&phonyBuild,0,(bool *)0x0);
      std::__cxx11::string::~string((string *)&cmdLists);
      std::__cxx11::string::~string((string *)&ccg);
      goto LAB_0023d989;
    }
    std::__cxx11::string::~string((string *)&cmdLists);
  }
  std::__cxx11::string::~string((string *)&ccg);
LAB_0023d9ce:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  cmNinjaBuild::~cmNinjaBuild(&phonyBuild);
  std::__cxx11::string::~string((string *)&utilCommandName);
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
  cmLocalNinjaGenerator* lg = this->GetLocalGenerator();
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  std::string utilCommandName = lg->GetCurrentBinaryDirectory();
  utilCommandName += "/CMakeFiles";
  utilCommandName += "/";
  utilCommandName += this->GetTargetName() + ".util";
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  cmNinjaBuild phonyBuild("phony");
  std::vector<std::string> commands;
  cmNinjaDeps deps, util_outputs(1, utilCommandName);

  bool uses_terminal = false;
  {
    std::array<std::vector<cmCustomCommand> const*, 2> const cmdLists = {
      { &genTarget->GetPreBuildCommands(), &genTarget->GetPostBuildCommands() }
    };

    for (std::vector<cmCustomCommand> const* cmdList : cmdLists) {
      for (cmCustomCommand const& ci : *cmdList) {
        cmCustomCommandGenerator ccg(ci, this->GetConfigName(), lg);
        lg->AppendCustomCommandDeps(ccg, deps);
        lg->AppendCustomCommandLines(ccg, commands);
        std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(util_outputs), MapToNinjaPath());
        if (ci.GetUsesTerminal()) {
          uses_terminal = true;
        }
      }
    }
  }

  {
    std::string const& config =
      this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::vector<cmSourceFile*> sources;
    genTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* source : sources) {
      if (cmCustomCommand const* cc = source->GetCustomCommand()) {
        cmCustomCommandGenerator ccg(*cc, this->GetConfigName(), lg);
        lg->AddCustomCommandTarget(cc, genTarget);

        // Depend on all custom command outputs.
        const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
        const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
        std::transform(ccOutputs.begin(), ccOutputs.end(),
                       std::back_inserter(deps), MapToNinjaPath());
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(deps), MapToNinjaPath());
      }
    }
  }

  lg->AppendTargetOutputs(genTarget, phonyBuild.Outputs);
  lg->AppendTargetDepends(genTarget, deps);

  if (commands.empty()) {
    phonyBuild.Comment = "Utility command for " + this->GetTargetName();
    phonyBuild.ExplicitDeps = std::move(deps);
    gg->WriteBuild(this->GetBuildFileStream(), phonyBuild);
  } else {
    std::string command =
      lg->BuildCommandLine(commands, "utility", this->GeneratorTarget);
    std::string desc;
    const char* echoStr = genTarget->GetProperty("EchoString");
    if (echoStr) {
      desc = echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos) {
      return;
    }

    for (std::string const& util_output : util_outputs) {
      gg->SeenCustomCommandOutput(util_output);
    }

    gg->WriteCustomCommandBuild(command, desc,
                                "Utility command for " + this->GetTargetName(),
                                /*depfile*/ "", /*job_pool*/ "", uses_terminal,
                                /*restat*/ true, util_outputs, deps);

    phonyBuild.ExplicitDeps.push_back(utilCommandName);
    gg->WriteBuild(this->GetBuildFileStream(), phonyBuild);
  }

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
    gg->AddTargetAlias(this->GetTargetName(), genTarget);
  }
}